

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniformxx.hpp
# Opt level: O2

ret_t trng::utility::
      u01xx_traits<double,_1UL,_trng::lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U>_>::addin
                (lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U> *r)

{
  result_type rVar1;
  
  rVar1 = lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U>::operator()(r);
  return (double)rVar1;
}

Assistant:

TRNG_CUDA_ENABLE
      static ret_t addin(prng_t &r) {
        const result_type x{r() - prng_t::min()};
        if (int_ok)
          return static_cast<ret_t>(static_cast<int>(x));
        else if (long_ok)
          return static_cast<ret_t>(static_cast<long>(x));
        else if (long_long_ok)
          return static_cast<ret_t>(static_cast<long long>(x));
        else if (use_ll_of_shifted)
          return static_cast<ret_t>(static_cast<long long>(x >> 1));
        else
          return static_cast<ret_t>(x);
      }